

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  long lVar1;
  size_type sVar2;
  size_type sVar3;
  cmListFileFunction *pcVar4;
  char cVar5;
  _func_int *p_Var6;
  ostream *poVar7;
  cmCommandContext *in_RCX;
  _func_int *p_Var8;
  void *pvVar9;
  _Map_pointer ppvVar10;
  _func_int *p_Var11;
  void *__src;
  long lVar12;
  cmListFileContext closingContext;
  ostringstream e;
  string local_210;
  cmListFileContext local_1f0;
  undefined1 local_1a8 [376];
  
  if ((_func_int **)fb[9].StartingContext.Line == fb[10]._vptr_cmFunctionBlocker) {
    p_Var6 = (_func_int *)0x0;
  }
  else {
    p_Var6 = fb[10]._vptr_cmFunctionBlocker[-1];
  }
  sVar2 = fb[9].StartingContext.FilePath._M_string_length;
  sVar3 = fb[9].StartingContext.FilePath.field_2._M_allocated_capacity;
  p_Var11 = (_func_int *)((long)(sVar3 - sVar2) >> 3);
  ppvVar10 = (_Map_pointer)0x0;
  lVar12 = 0;
  p_Var8 = p_Var11;
  do {
    if (p_Var8 <= p_Var6) goto LAB_001824c6;
    p_Var8 = p_Var8 + -1;
    pcVar4 = *(cmListFileFunction **)((sVar3 - 8) + lVar12);
    lVar12 = lVar12 + -8;
  } while (pcVar4 != lff);
  cVar5 = (**(code **)((pcVar4->super_cmCommandContext).Name.Lower._M_dataplus._M_p + 8))();
  if (cVar5 == '\0') {
    cmListFileContext::FromCommandContext
              (&local_1f0,in_RCX,
               (string *)&(lff->super_cmCommandContext).Name.Original._M_string_length);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"A logical block opening on the line\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar7 = operator<<((ostream *)local_1a8,
                        (cmListFileContext *)
                        &(lff->super_cmCommandContext).Name.Lower._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"closes on the line\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
    poVar7 = operator<<(poVar7,&local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"with mis-matching arguments.",0x1c);
    std::__cxx11::stringbuf::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.FilePath._M_dataplus._M_p != &local_1f0.FilePath.field_2) {
      operator_delete(local_1f0.FilePath._M_dataplus._M_p,
                      local_1f0.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.Name._M_dataplus._M_p != &local_1f0.Name.field_2) {
      operator_delete(local_1f0.Name._M_dataplus._M_p,
                      local_1f0.Name.field_2._M_allocated_capacity + 1);
    }
  }
  lVar1 = sVar2 + (long)p_Var11 * 8;
  ppvVar10 = *(_Map_pointer *)(lVar1 + lVar12);
  __src = (void *)(lVar1 + lVar12 + 8);
  pvVar9 = (void *)fb[9].StartingContext.FilePath.field_2._M_allocated_capacity;
  if (__src != pvVar9) {
    memmove((void *)(lVar1 + lVar12),__src,(long)pvVar9 + (-lVar12 - lVar1) + -8);
    pvVar9 = (void *)fb[9].StartingContext.FilePath.field_2._M_allocated_capacity;
  }
  fb[9].StartingContext.FilePath.field_2._M_allocated_capacity = (long)pvVar9 - 8;
LAB_001824c6:
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = ppvVar10;
  return (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
         (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmFunctionBlocker> cmMakefile::RemoveFunctionBlocker(
  cmFunctionBlocker* fb, const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if (!this->FunctionBlockerBarriers.empty()) {
    barrier = this->FunctionBlockerBarriers.back();
  }

  // Search for the function blocker whose scope this command ends.
  for (FunctionBlockersType::size_type i = this->FunctionBlockers.size();
       i > barrier; --i) {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb) {
      // Warn if the arguments do not match, but always remove.
      if (!(*pos)->ShouldRemove(lff, *this)) {
        cmListFileContext const& lfc = fb->GetStartingContext();
        cmListFileContext closingContext =
          cmListFileContext::FromCommandContext(lff, lfc.FilePath);
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        /* clang-format on */
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return std::unique_ptr<cmFunctionBlocker>(b);
    }
  }

  return std::unique_ptr<cmFunctionBlocker>();
}